

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_functions.cpp
# Opt level: O2

void Am_Move_Cursor_To(Am_Object *text,int n)

{
  int iVar1;
  int iVar2;
  Am_Value *in_value;
  char *pcVar3;
  Am_String p;
  Am_Object AStack_28;
  Am_String local_20;
  
  in_value = Am_Object::Get(text,0xab,0);
  Am_String::Am_String(&local_20,in_value);
  pcVar3 = Am_String::operator_cast_to_char_(&local_20);
  iVar1 = ml_strlen(pcVar3);
  pcVar3 = Am_String::operator_cast_to_char_(&local_20);
  iVar2 = ml_head_pos_str(pcVar3);
  if ((n <= iVar1) && (iVar2 <= n)) {
    Am_Object::Set(text,0xad,n,0);
  }
  Am_Object::Am_Object(&AStack_28,text);
  Am_Set_Pending_Delete(&AStack_28,false);
  Am_Object::~Am_Object(&AStack_28);
  Am_String::~Am_String(&local_20);
  return;
}

Assistant:

void
Am_Move_Cursor_To(Am_Object text, int n)
{
  Am_String p = text.Get(Am_TEXT);
  int str_len = ml_strlen((const char *)p);
  int head_pos = ml_head_pos_str((const char *)p);

  if (n >= head_pos && n <= str_len)
    text.Set(Am_CURSOR_INDEX, n);
  Am_Set_Pending_Delete(text, false);
}